

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

Abc_Obj_t * Abc_SclAddOneInv(Bus_Man_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vFanouts,float Gain)

{
  float fVar1;
  int iVar2;
  void *pvVar3;
  long *plVar4;
  long lVar5;
  Vec_Flt_t *pVVar6;
  Abc_Obj_t *pObj_00;
  Vec_Int_t *p_00;
  Abc_Ntk_t *pFanout;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Abc_Obj_t *pFanin;
  float *pfVar10;
  SC_Cell *pSVar11;
  char *__function;
  int Fill;
  ulong uVar12;
  char *__file;
  char *__assertion;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  if (0 < (p->pInv->vPins).nSize) {
    pvVar3 = *(p->pInv->vPins).pArray;
    fVar16 = *(float *)((long)pvVar3 + 0x10);
    fVar1 = *(float *)((long)pvVar3 + 0x14);
    uVar8 = p->pPars->nDegree;
    uVar7 = vFanouts->nSize;
    if ((int)uVar8 < vFanouts->nSize) {
      uVar7 = uVar8;
    }
    Bus_SclCheckSortedFanout(vFanouts);
    uVar13 = 0;
    uVar12 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar12 = uVar13;
    }
    fVar17 = 0.0;
    do {
      if (uVar12 == uVar13) goto LAB_0045943e;
      if ((long)vFanouts->nSize <= (long)uVar13) goto LAB_00459887;
      plVar4 = (long *)vFanouts->pArray[uVar13];
      fVar14 = Abc_SclFindWireLoad(p->vWireCaps,(int)uVar13);
      fVar15 = Abc_SclFindWireLoad(p->vWireCaps,(int)uVar13 + 1);
      iVar9 = (int)plVar4[2];
      if (((long)iVar9 < 0) ||
         (lVar5 = *(long *)(*(long *)(*plVar4 + 0x168) + 0x38), *(int *)(lVar5 + 4) <= iVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      fVar17 = fVar17 + fVar15 + (*(float *)(*(long *)(lVar5 + 8) + (long)iVar9 * 4) - fVar14);
      uVar13 = uVar13 + 1;
    } while (fVar17 <= (fVar16 * 0.5 + fVar1 * 0.5) * Gain);
    uVar12 = uVar13 & 0xffffffff;
LAB_0045943e:
    if (p->pPars->fAddBufs == 0) {
      pFanin = Abc_NtkCreateNodeInv(p->pNtk,(Abc_Obj_t *)0x0);
    }
    else {
      pFanin = Abc_NtkCreateNodeBuf(p->pNtk,(Abc_Obj_t *)0x0);
    }
    uVar8 = pFanin->Id;
    pVVar6 = p->vCins;
    if (uVar8 != pVVar6->nSize) {
      __assert_fail("(int)Abc_ObjId(pInv) == Vec_FltSize(p->vCins)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                    ,0x170,
                    "Abc_Obj_t *Abc_SclAddOneInv(Bus_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, float)");
    }
    if (uVar8 == pVVar6->nCap) {
      if ((int)uVar8 < 0x10) {
        if (pVVar6->pArray == (float *)0x0) {
          pfVar10 = (float *)malloc(0x40);
        }
        else {
          pfVar10 = (float *)realloc(pVVar6->pArray,0x40);
        }
        pVVar6->pArray = pfVar10;
        pVVar6->nCap = 0x10;
      }
      else {
        if (pVVar6->pArray == (float *)0x0) {
          pfVar10 = (float *)malloc((ulong)uVar8 << 3);
        }
        else {
          pfVar10 = (float *)realloc(pVVar6->pArray,(ulong)uVar8 << 3);
        }
        pVVar6->pArray = pfVar10;
        pVVar6->nCap = uVar8 * 2;
      }
    }
    else {
      pfVar10 = pVVar6->pArray;
    }
    iVar9 = pVVar6->nSize;
    pVVar6->nSize = iVar9 + 1;
    pfVar10[iVar9] = 0.0;
    pVVar6 = p->vETimes;
    uVar8 = pVVar6->nSize;
    if (uVar8 == pVVar6->nCap) {
      if ((int)uVar8 < 0x10) {
        if (pVVar6->pArray == (float *)0x0) {
          pfVar10 = (float *)malloc(0x40);
        }
        else {
          pfVar10 = (float *)realloc(pVVar6->pArray,0x40);
        }
        pVVar6->pArray = pfVar10;
        pVVar6->nCap = 0x10;
      }
      else {
        if (pVVar6->pArray == (float *)0x0) {
          pfVar10 = (float *)malloc((ulong)uVar8 << 3);
        }
        else {
          pfVar10 = (float *)realloc(pVVar6->pArray,(ulong)uVar8 << 3);
        }
        pVVar6->pArray = pfVar10;
        pVVar6->nCap = uVar8 * 2;
      }
    }
    else {
      pfVar10 = pVVar6->pArray;
    }
    iVar9 = pVVar6->nSize;
    pVVar6->nSize = iVar9 + 1;
    pfVar10[iVar9] = 0.0;
    pVVar6 = p->vLoads;
    uVar8 = pVVar6->nSize;
    if (uVar8 == pVVar6->nCap) {
      if ((int)uVar8 < 0x10) {
        if (pVVar6->pArray == (float *)0x0) {
          pfVar10 = (float *)malloc(0x40);
        }
        else {
          pfVar10 = (float *)realloc(pVVar6->pArray,0x40);
        }
        pVVar6->pArray = pfVar10;
        pVVar6->nCap = 0x10;
      }
      else {
        if (pVVar6->pArray == (float *)0x0) {
          pfVar10 = (float *)malloc((ulong)uVar8 << 3);
        }
        else {
          pfVar10 = (float *)realloc(pVVar6->pArray,(ulong)uVar8 << 3);
        }
        pVVar6->pArray = pfVar10;
        pVVar6->nCap = uVar8 * 2;
      }
    }
    else {
      pfVar10 = pVVar6->pArray;
    }
    iVar9 = pVVar6->nSize;
    pVVar6->nSize = iVar9 + 1;
    pfVar10[iVar9] = 0.0;
    pVVar6 = p->vDepts;
    uVar8 = pVVar6->nSize;
    if (uVar8 == pVVar6->nCap) {
      if ((int)uVar8 < 0x10) {
        if (pVVar6->pArray == (float *)0x0) {
          pfVar10 = (float *)malloc(0x40);
        }
        else {
          pfVar10 = (float *)realloc(pVVar6->pArray,0x40);
        }
        pVVar6->pArray = pfVar10;
        pVVar6->nCap = 0x10;
      }
      else {
        if (pVVar6->pArray == (float *)0x0) {
          pfVar10 = (float *)malloc((ulong)uVar8 << 3);
        }
        else {
          pfVar10 = (float *)realloc(pVVar6->pArray,(ulong)uVar8 << 3);
        }
        pVVar6->pArray = pfVar10;
        pVVar6->nCap = uVar8 * 2;
      }
    }
    else {
      pfVar10 = pVVar6->pArray;
    }
    iVar9 = pVVar6->nSize;
    pVVar6->nSize = iVar9 + 1;
    pfVar10[iVar9] = 0.0;
    uVar8 = 2;
    if (2 < (uint)uVar12) {
      uVar8 = (uint)uVar12;
    }
    if (vFanouts->nSize <= (int)uVar8) {
      uVar8 = vFanouts->nSize;
    }
    if (0 < (int)uVar8) {
      uVar12 = 0;
      do {
        if ((long)vFanouts->nSize <= (long)uVar12) goto LAB_00459887;
        pObj_00 = (Abc_Obj_t *)vFanouts->pArray[uVar12];
        vFanouts->pArray[uVar12] = (void *)0x0;
        if ((pObj_00->vFanins).nSize == 0) {
          Abc_ObjAddFanin(pObj_00,pFanin);
        }
        else {
          Abc_ObjPatchFanin(pObj_00,pObj,pFanin);
        }
        uVar12 = uVar12 + 1;
      } while (uVar8 != uVar12);
    }
    pSVar11 = Abc_SclFindSmallestGate(p->pInv,fVar17 / Gain);
    p_00 = p->pNtk->vGates;
    iVar9 = pFanin->Id;
    iVar2 = pSVar11->Id;
    Vec_IntFillExtra(p_00,iVar9 + 1,Fill);
    if (((long)iVar9 < 0) || (p_00->nSize <= iVar9)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    p_00->pArray[iVar9] = iVar2;
    Abc_NtkComputeNodeDeparture(pFanin,(float)p->pPars->Slew);
    fVar16 = Abc_NtkComputeNodeLoad(p,pFanin);
    if ((1.0 <= fVar16 - fVar17) || (1.0 <= fVar17 - fVar16)) {
      __assertion = "LoadNew - Load < 1 && Load - LoadNew < 1";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c";
      __function = "Abc_Obj_t *Abc_SclAddOneInv(Bus_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, float)";
      goto LAB_0045989c;
    }
    if (0 < (pSVar11->vPins).nSize) {
      iVar9 = pFanin->Id;
      if (-1 < (long)iVar9) {
        pFanout = pFanin->pNtk;
        lVar5 = *(long *)((long)pFanout->pBSMan + 0x38);
        if (iVar9 < *(int *)(lVar5 + 4)) {
          pvVar3 = *(pSVar11->vPins).pArray;
          *(float *)(*(long *)(lVar5 + 8) + (long)iVar9 * 4) =
               *(float *)((long)pvVar3 + 0x10) * 0.5 + *(float *)((long)pvVar3 + 0x14) * 0.5;
          fVar16 = Abc_NtkComputeEdgeDept((Abc_Obj_t *)pFanout,iVar9,(float)p->pPars->Slew);
          iVar9 = pFanin->Id;
          if ((-1 < (long)iVar9) &&
             (lVar5 = *(long *)((long)pFanin->pNtk->pBSMan + 0x40), iVar9 < *(int *)(lVar5 + 4))) {
            *(float *)(*(long *)(lVar5 + 8) + (long)iVar9 * 4) = fVar16;
            if ((p->pNtk->vPhases != (Vec_Int_t *)0x0) && (iVar9 = Abc_SclIsInv(pFanin), iVar9 != 0)
               ) {
              Abc_NodeInvUpdateFanPolarity(pFanin);
            }
            return pFanin;
          }
        }
      }
      __assertion = "i >= 0 && i < p->nSize";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h";
      __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
      goto LAB_0045989c;
    }
  }
LAB_00459887:
  __assertion = "i >= 0 && i < p->nSize";
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h";
  __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_0045989c:
  __assert_fail(__assertion,__file,0x184,__function);
}

Assistant:

Abc_Obj_t * Abc_SclAddOneInv( Bus_Man_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vFanouts, float Gain )
{
    SC_Cell * pCellNew;
    Abc_Obj_t * pFanout, * pInv;
    float Target = SC_CellPinCap(p->pInv, 0) * Gain;
    float LoadWirePrev, LoadWireThis, LoadNew, Load = 0;
    int Limit = Abc_MinInt( p->pPars->nDegree, Vec_PtrSize(vFanouts) );
    int i, iStop;
    Bus_SclCheckSortedFanout( vFanouts );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, iStop, Limit )
    {
        LoadWirePrev = Abc_SclFindWireLoad( p->vWireCaps, iStop );
        LoadWireThis = Abc_SclFindWireLoad( p->vWireCaps, iStop+1 );
        Load += Bus_SclObjCin( pFanout ) - LoadWirePrev + LoadWireThis;
        if ( Load > Target )
        {
            iStop++;
            break;
        }
    }
    // create inverter
    if ( p->pPars->fAddBufs )
        pInv = Abc_NtkCreateNodeBuf( p->pNtk, NULL );
    else
        pInv = Abc_NtkCreateNodeInv( p->pNtk, NULL );
    assert( (int)Abc_ObjId(pInv) == Vec_FltSize(p->vCins) );
    Vec_FltPush( p->vCins,   0 );
    Vec_FltPush( p->vETimes, 0 );
    Vec_FltPush( p->vLoads,  0 );
    Vec_FltPush( p->vDepts,  0 );
    Limit = Abc_MinInt( Abc_MaxInt(iStop, 2), Vec_PtrSize(vFanouts) );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, i, Limit )
    {
        Vec_PtrWriteEntry( vFanouts, i, NULL );
        if ( Abc_ObjFaninNum(pFanout) == 0 )
            Abc_ObjAddFanin( pFanout, pInv );
        else
            Abc_ObjPatchFanin( pFanout, pObj, pInv );
    }
    // set the gate
    pCellNew = Abc_SclFindSmallestGate( p->pInv, Load / Gain );
    Vec_IntSetEntry( p->pNtk->vGates, Abc_ObjId(pInv), pCellNew->Id );
    // set departure and load
    Abc_NtkComputeNodeDeparture( pInv, p->pPars->Slew );
    LoadNew = Abc_NtkComputeNodeLoad( p, pInv );
    assert( LoadNew - Load < 1 && Load - LoadNew < 1 );
    // set fanout info for the inverter
    Bus_SclObjSetCin( pInv, SC_CellPinCap(pCellNew, 0) );
    Bus_SclObjSetETime( pInv, Abc_NtkComputeEdgeDept(pInv, 0, p->pPars->Slew) );
    // update phases
    if ( p->pNtk->vPhases && Abc_SclIsInv(pInv) )
        Abc_NodeInvUpdateFanPolarity( pInv );
    return pInv;
}